

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void tcg_gen_bswap32_i64_mipsel(TCGContext_conflict4 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg)

{
  TCGOp *pTVar1;
  uintptr_t o_1;
  uintptr_t o;
  
  pTVar1 = tcg_emit_op_mipsel(tcg_ctx,INDEX_op_bswap32_i64);
  pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
  pTVar1->args[1] = (TCGArg)(arg + (long)tcg_ctx);
  return;
}

Assistant:

void tcg_gen_bswap32_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg)
{
#if TCG_TARGET_REG_BITS == 32
        tcg_gen_bswap32_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_LOW(tcg_ctx, arg));
        tcg_gen_movi_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), 0);
#elif TCG_TARGET_HAS_bswap32_i64
        tcg_gen_op2_i64(tcg_ctx, INDEX_op_bswap32_i64, ret, arg);
#else
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 t2 = tcg_const_i64(tcg_ctx, 0x00ff00ff);

                                        /* arg = ....abcd */
        tcg_gen_shri_i64(tcg_ctx, t0, arg, 8);   /*  t0 = .....abc */
        tcg_gen_and_i64(tcg_ctx, t1, arg, t2);   /*  t1 = .....b.d */
        tcg_gen_and_i64(tcg_ctx, t0, t0, t2);    /*  t0 = .....a.c */
        tcg_gen_shli_i64(tcg_ctx, t1, t1, 8);    /*  t1 = ....b.d. */
        tcg_gen_or_i64(tcg_ctx, ret, t0, t1);    /* ret = ....badc */

        tcg_gen_shli_i64(tcg_ctx, t1, ret, 48);  /*  t1 = dc...... */
        tcg_gen_shri_i64(tcg_ctx, t0, ret, 16);  /*  t0 = ......ba */
        tcg_gen_shri_i64(tcg_ctx, t1, t1, 32);   /*  t1 = ....dc.. */
        tcg_gen_or_i64(tcg_ctx, ret, t0, t1);    /* ret = ....dcba */

        tcg_temp_free_i64(tcg_ctx, t0);
        tcg_temp_free_i64(tcg_ctx, t1);
        tcg_temp_free_i64(tcg_ctx, t2);
#endif
}